

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

cm_message_output cm_get_output(void)

{
  int iVar1;
  char *__s1;
  char *env;
  cm_message_output output;
  cm_message_output local_4;
  
  local_4 = global_msg_output;
  __s1 = getenv("CMOCKA_MESSAGE_OUTPUT");
  if (__s1 != (char *)0x0) {
    iVar1 = strcasecmp(__s1,"STDOUT");
    if (iVar1 == 0) {
      local_4 = CM_OUTPUT_STDOUT;
    }
    else {
      iVar1 = strcasecmp(__s1,"SUBUNIT");
      if (iVar1 == 0) {
        local_4 = CM_OUTPUT_SUBUNIT;
      }
      else {
        iVar1 = strcasecmp(__s1,"TAP");
        if (iVar1 == 0) {
          local_4 = CM_OUTPUT_TAP;
        }
        else {
          iVar1 = strcasecmp(__s1,"XML");
          if (iVar1 == 0) {
            local_4 = CM_OUTPUT_XML;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static enum cm_message_output cm_get_output(void)
{
    enum cm_message_output output = global_msg_output;
    char *env;

    env = getenv("CMOCKA_MESSAGE_OUTPUT");
    if (env != NULL) {
        if (strcasecmp(env, "STDOUT") == 0) {
            output = CM_OUTPUT_STDOUT;
        } else if (strcasecmp(env, "SUBUNIT") == 0) {
            output = CM_OUTPUT_SUBUNIT;
        } else if (strcasecmp(env, "TAP") == 0) {
            output = CM_OUTPUT_TAP;
        } else if (strcasecmp(env, "XML") == 0) {
            output = CM_OUTPUT_XML;
        }
    }

    return output;
}